

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O0

Harris * __thiscall Harris::MeanFilter(Harris *this,Mat *intImg,int range)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  int in_ECX;
  undefined4 in_register_00000014;
  Mat *this_00;
  int local_30;
  int local_2c;
  int c;
  int r;
  int range_local;
  Mat *intImg_local;
  Harris *this_local;
  Mat *medianFilteredMat;
  
  this_00 = (Mat *)CONCAT44(in_register_00000014,range);
  cv::Mat::Mat(&this->harrisResponses,*(int *)(this_00 + 8) + in_ECX * -2,
               *(int *)(this_00 + 0xc) + in_ECX * -2,5);
  for (local_2c = in_ECX; local_30 = in_ECX, local_2c < *(int *)(this_00 + 8) - in_ECX;
      local_2c = local_2c + 1) {
    for (; local_30 < *(int *)(this_00 + 0xc) - in_ECX; local_30 = local_30 + 1) {
      pfVar5 = cv::Mat::at<float>(this_00,local_2c + in_ECX,local_30 + in_ECX);
      fVar1 = *pfVar5;
      pfVar5 = cv::Mat::at<float>(this_00,local_2c - in_ECX,local_30 - in_ECX);
      fVar2 = *pfVar5;
      pfVar5 = cv::Mat::at<float>(this_00,local_2c + in_ECX,local_30 - in_ECX);
      fVar3 = *pfVar5;
      pfVar5 = cv::Mat::at<float>(this_00,local_2c - in_ECX,local_30 + in_ECX);
      fVar4 = *pfVar5;
      pfVar5 = cv::Mat::at<float>(&this->harrisResponses,local_2c - in_ECX,local_30 - in_ECX);
      *pfVar5 = ((fVar1 + fVar2) - fVar3) - fVar4;
    }
  }
  return this;
}

Assistant:

Mat Harris::MeanFilter(Mat& intImg, int range) {
    Mat medianFilteredMat(intImg.rows-range*2, intImg.cols-range*2, CV_32F);

    for (int r = range; r < intImg.rows-range; r++) {
        for (int c = range; c < intImg.cols-range; c++) {
            medianFilteredMat.at<float>(r-range, c-range) = 
                intImg.at<float>(r+range, c+range)
                + intImg.at<float>(r-range, c-range)
                - intImg.at<float>(r+range, c-range)
                - intImg.at<float>(r-range, c+range);
        }
    }

    return medianFilteredMat;
}